

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalFileLog.cpp
# Opt level: O1

string * ApprovalFileLog::getLogFilePath_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  string *in_RDI;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"./.approval_tests_temp","");
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x1308c7);
  paVar1 = &local_68.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68.field_2._8_8_ = plVar3[3];
    local_68._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_68._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar2 = plVar3[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar3;
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
  }
  in_RDI->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"./.approval_tests_temp","");
  ApprovalTests::SystemUtils::ensureDirectoryExists(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

std::string ApprovalFileLog::getLogFilePath()
{
    //auto const rootDirectory = ApprovalTests::TestName::getRootDirectory();
    auto const rootDirectory = "";
    // Note: Need to figure out where the actual root directory is.
    std::string const filePath =
        rootDirectory + std::string(APPROVAL_TEMP_DIRECTORY) + "/.approved_files.log";
    ApprovalTests::SystemUtils::ensureDirectoryExists(APPROVAL_TEMP_DIRECTORY);
    return filePath;
}